

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

optional<pbrt::CameraRay> * __thiscall
pbrt::RealisticCamera::GenerateRay
          (optional<pbrt::CameraRay> *__return_storage_ptr__,RealisticCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Tuple2<pbrt::Point2,_float> TVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  Float FVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float n2;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Point3f PVar22;
  float local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  Ray local_98;
  Ray local_70;
  anon_struct_8_0_00000001_for___align local_48;
  float fStack_40;
  float fStack_3c;
  float fStack_38;
  undefined8 uStack_34;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_28;
  
  auVar20._8_4_ = 0x3f800000;
  auVar20._0_8_ = 0x3f8000003f800000;
  auVar20._12_4_ = 0x3f800000;
  TVar4 = (this->physicalExtent).pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar12._4_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)((this->super_CameraBase).film.
                            super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                           0xffffffffffff);
  auVar6 = vcvtdq2ps_avx(auVar8);
  auVar6 = vdivps_avx(auVar12,auVar6);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (this->physicalExtent).pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar8 = vsubps_avx(auVar20,auVar6);
  auVar9._0_4_ = auVar6._0_4_ * TVar4.x;
  auVar9._4_4_ = auVar6._4_4_ * TVar4.y;
  auVar9._8_4_ = auVar6._8_4_ * 0.0;
  auVar9._12_4_ = auVar6._12_4_ * 0.0;
  local_c8 = vfmadd231ps_fma(auVar9,auVar13,auVar8);
  auVar11 = ZEXT856(local_c8._8_8_);
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  local_a8 = vxorps_avx512vl(local_c8,auVar6);
  local_70.o.super_Tuple3<pbrt::Point3,_float>.x = local_a8._0_4_;
  _local_b8 = vmovshdup_avx(local_c8);
  local_70.o.super_Tuple3<pbrt::Point3,_float>.y = local_b8._0_4_;
  PVar22 = SampleExitPupil(this,(Point2f *)&local_70,&sample.pLens,&local_cc);
  local_70.d.super_Tuple3<pbrt::Vector3,_float>.z = PVar22.super_Tuple3<pbrt::Point3,_float>.z;
  auVar10._0_8_ = PVar22.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  local_98.d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_98.d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  auVar17._0_4_ = PVar22.super_Tuple3<pbrt::Point3,_float>.x + local_c8._0_4_;
  auVar17._4_4_ = PVar22.super_Tuple3<pbrt::Point3,_float>.y + local_c8._4_4_;
  auVar17._8_4_ = auVar11._0_4_ + local_c8._8_4_;
  auVar17._12_4_ = auVar11._4_4_ + local_c8._12_4_;
  auVar6 = vsubps_avx(auVar10._0_16_,local_c8);
  auVar6 = vblendps_avx(auVar17,auVar6,2);
  local_70.o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_a8._0_4_;
  local_a8._0_4_ = local_70.d.super_Tuple3<pbrt::Vector3,_float>.z;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_b8._0_4_;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_70.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar6);
  local_98.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_98.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_70.time = 0.0;
  local_70.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_98.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_98.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_c8 = auVar17;
  _local_b8 = auVar6;
  FVar7 = TraceLensesFromFilm(this,&local_70,&local_98);
  if ((FVar7 != 0.0) || (NAN(FVar7))) {
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(sample.time * (this->super_CameraBase).shutterClose)),
                             ZEXT416((uint)(1.0 - sample.time)),
                             ZEXT416((uint)(this->super_CameraBase).shutterOpen));
    local_98.time = auVar6._0_4_;
    local_98.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )(this->super_CameraBase).medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
    AnimatedTransform::operator()((Ray *)&local_48,(AnimatedTransform *)this,&local_98,(Float *)0x0)
    ;
    local_98.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_34;
    local_98.time = SUB84(uStack_34,4);
    auVar14._4_4_ = fStack_38;
    auVar14._0_4_ = fStack_3c;
    auVar14._8_8_ = 0;
    auVar18._0_4_ = fStack_3c * fStack_3c;
    auVar18._4_4_ = fStack_38 * fStack_38;
    auVar18._8_8_ = 0;
    auVar6 = vmovshdup_avx(auVar18);
    auVar6 = vfmadd231ss_fma(auVar6,auVar14,auVar14);
    auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)local_98.d.super_Tuple3<pbrt::Vector3,_float>.z),
                             ZEXT416((uint)local_98.d.super_Tuple3<pbrt::Vector3,_float>.z));
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    fVar15 = auVar6._0_4_;
    auVar21._4_4_ = fVar15;
    auVar21._0_4_ = fVar15;
    auVar21._8_4_ = fVar15;
    auVar21._12_4_ = fVar15;
    auVar6 = vdivps_avx(auVar14,auVar21);
    auVar19._0_4_ = (float)local_b8._0_4_ * (float)local_b8._0_4_;
    auVar19._4_4_ = (float)local_b8._4_4_ * (float)local_b8._4_4_;
    auVar19._8_4_ = fStack_b0 * fStack_b0;
    auVar19._12_4_ = fStack_ac * fStack_ac;
    auVar8 = vmovshdup_avx(auVar19);
    auVar8 = vfmadd213ss_fma(local_c8,local_c8,auVar8);
    uVar5 = vmovlps_avx(auVar6);
    local_98.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar5;
    fVar1 = (this->super_CameraBase).shutterClose;
    fVar2 = (this->super_CameraBase).shutterOpen;
    auVar6 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_a8._0_4_),ZEXT416((uint)local_a8._0_4_));
    fVar3 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
    __return_storage_ptr__->set = true;
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    fVar16 = (float)local_a8._0_4_ / auVar6._0_4_;
    (__return_storage_ptr__->optionalValue).__align = local_48;
    *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
         CONCAT44(local_98.d.super_Tuple3<pbrt::Vector3,_float>.x,fStack_40);
    fVar16 = fVar16 * fVar16;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc) = uVar5;
    *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x14) =
         CONCAT44(local_98.time,local_98.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar15);
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_28.bits;
    fVar1 = (((fVar1 - fVar2) * fVar16 * fVar16 * local_cc) / (fVar3 * fVar3)) * FVar7;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = fVar1;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x2c) = fVar1;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x30) = fVar1;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x34) = fVar1;
  }
  else {
    *__return_storage_ptr__ = (optional<pbrt::CameraRay>)ZEXT1264(ZEXT812(0));
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRay> RealisticCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Find point on film, _pFilm_, corresponding to _sample.pFilm_
    Point2f s(sample.pFilm.x / film.FullResolution().x,
              sample.pFilm.y / film.FullResolution().y);
    Point2f pFilm2 = physicalExtent.Lerp(s);
    Point3f pFilm(-pFilm2.x, pFilm2.y, 0);

    // Trace ray from _pFilm_ through lens system
    Float exitPupilBoundsArea;
    Point3f pRear =
        SampleExitPupil(Point2f(pFilm.x, pFilm.y), sample.pLens, &exitPupilBoundsArea);
    Ray rFilm(pFilm, pRear - pFilm);
    Ray ray;
    Float weight = TraceLensesFromFilm(rFilm, &ray);
    if (weight == 0)
        return {};

    // Finish initialization of _RealisticCamera_ ray
    ray.time = SampleTime(sample.time);
    ray.medium = medium;
    ray = RenderFromCamera(ray);
    ray.d = Normalize(ray.d);

    // Compute weighting for _RealisticCamera_ ray
    Float cosTheta = Normalize(rFilm.d).z;
    weight *= (shutterClose - shutterOpen) * Pow<4>(cosTheta) * exitPupilBoundsArea /
              Sqr(LensRearZ());

    return CameraRay{ray, SampledSpectrum(weight)};
}